

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O2

int TeleportGetNumBuffered(int stream)

{
  int iVar1;
  SharedMemoryHandle *pSVar2;
  int iVar3;
  
  pSVar2 = Teleport::GetSharedMemory();
  iVar3 = pSVar2->data->streams[stream].writepos - pSVar2->data->streams[stream].readpos;
  iVar1 = iVar3 + 0x15888;
  if (-1 < iVar3) {
    iVar1 = iVar3;
  }
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int TeleportGetNumBuffered(int stream)
{
    Teleport::Stream& s = Teleport::GetSharedMemory()->streams[stream];
    return s.GetNumBuffered();
}